

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bst.c
# Opt level: O3

void erased_node(vmd_bst_t *tree,vmd_bst_node_t *node)

{
  vmd_bst_node_t *pvVar1;
  vmd_bst_node_t **ppvVar2;
  
  if (tree->tip == (vmd_bst_rev_t *)0x0) {
    free(node);
    return;
  }
  if ((node->field_0x20 & 0x20) == 0) {
    node->next = tree->erased;
    tree->erased = node;
    return;
  }
  pvVar1 = tree->free;
  if (pvVar1 == (vmd_bst_node_t *)0x0) {
    ppvVar2 = &tree->free;
    node->child[1] = node;
    node->child[0] = node;
  }
  else {
    node->child[0] = pvVar1;
    node->child[1] = pvVar1->child[1];
    pvVar1->child[1] = node;
    ppvVar2 = node->child[1]->child;
  }
  *ppvVar2 = node;
  return;
}

Assistant:

static void
erased_node(bst_t *tree, bst_node_t *node)
{
	if (tree->tip == NULL)
		free(node);
	else if (node->inserted)
		dlist_insert(&tree->free, node);
	else
		slist_push(&tree->erased, node);
}